

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimpledrag.cpp
# Opt level: O1

void __thiscall QBasicDrag::cancel(QBasicDrag *this)

{
  QObject::removeEventFilter(QCoreApplication::self);
  if (this->m_dndHasSetOverrideCursor == true) {
    QGuiApplication::restoreOverrideCursor();
    this->m_dndHasSetOverrideCursor = false;
  }
  QWindow::setVisible((QWindow *)this->m_drag_icon_window,false);
  return;
}

Assistant:

void QBasicDrag::cancel()
{
    disableEventFilter();
    restoreCursor();
    m_drag_icon_window->setVisible(false);
}